

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectFormatterTest_test_creating_basic_subject_from_string_Test
::TestBody(SubjectFormatterTest_test_creating_basic_subject_from_string_Test *this)

{
  char *message;
  AssertHelper local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  AssertionResult gtest_ar;
  Subject subject;
  SubjectBuilder builder;
  
  bidfx_public_api::price::subject::SubjectBuilder::SubjectBuilder(&builder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Symbol=EURGBP,Quantity=2500000",(allocator<char> *)&subject);
  bidfx_public_api::price::subject::SubjectFormatter::ParseSubject
            ((string *)FORMATTER,(SubjectBuilder *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  bidfx_public_api::price::subject::SubjectBuilder::CreateSubject();
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[31]>
            ((internal *)&gtest_ar,"subject.ToString()","\"Quantity=2500000,Symbol=EURGBP\"",
             &local_68,(char (*) [31])"Quantity=2500000,Symbol=EURGBP");
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_formatter_test.cpp"
               ,0x22,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&subject);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&builder);
  return;
}

Assistant:

TEST(SubjectFormatterTest, test_creating_basic_subject_from_string)
{
    SubjectBuilder builder = SubjectBuilder();
    FORMATTER.ParseSubject("Symbol=EURGBP,Quantity=2500000", builder);

    Subject subject = builder.CreateSubject();
    ASSERT_EQ(subject.ToString(), "Quantity=2500000,Symbol=EURGBP");
}